

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stty.c
# Opt level: O2

sexp_conflict
sexp_term_attrs_ispeed_set_x_stub
          (sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict arg0,sexp_conflict arg1)

{
  int iVar1;
  sexp_conflict psVar2;
  speed_t __speed;
  
  if (((ulong)arg0 & 3) != 0) {
    psVar2 = (sexp_conflict)sexp_type_exception(ctx,self,(long)(self->value).type.id >> 1);
    return psVar2;
  }
  if ((long)(self->value).type.id >> 1 == (ulong)arg0->tag) {
    if (((ulong)arg1 & 1) == 0) {
      if ((((ulong)arg1 & 2) != 0) || (arg1->tag != 0xc)) {
        psVar2 = (sexp_conflict)sexp_type_exception(ctx,self,2,arg1);
        return psVar2;
      }
      __speed = (speed_t)(arg1->value).string.length;
    }
    else {
      __speed = (speed_t)((long)arg1 >> 1);
    }
    iVar1 = cfsetispeed((termios *)(arg0->value).type.slots,__speed);
    return (sexp_conflict)((ulong)(iVar1 == 0) << 8 | 0x3e);
  }
  psVar2 = (sexp_conflict)sexp_type_exception();
  return psVar2;
}

Assistant:

sexp sexp_term_attrs_ispeed_set_x_stub (sexp ctx, sexp self, sexp_sint_t n, sexp arg0, sexp arg1) {
  int err = 0;
  sexp res;
  if (! (sexp_pointerp(arg0) && (sexp_pointer_tag(arg0) == sexp_unbox_fixnum(sexp_opcode_arg1_type(self)))))
    return sexp_type_exception(ctx, self, sexp_unbox_fixnum(sexp_opcode_arg1_type(self)), arg0);
  if (! sexp_exact_integerp(arg1))
    return sexp_type_exception(ctx, self, SEXP_FIXNUM, arg1);
  err = cfsetispeed((struct termios*)sexp_cpointer_value(arg0), sexp_uint_value(arg1));
  if (err) {
  res = SEXP_FALSE;
  } else {
  res = SEXP_TRUE;
  }
  return res;
}